

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::CallCallback(DNSResolve *this,string *hostname,string *ip)

{
  IDNSNotify *pIVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  allocator local_a1;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  cb_range;
  string *ip_local;
  string *hostname_local;
  DNSResolve *this_local;
  
  cb_range.second._M_node = (_Base_ptr)ip;
  _local_30 = std::
              multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
              ::equal_range(&this->hostname_to_cb_,hostname);
  bVar2 = std::operator==((_Self *)local_30,&cb_range.first);
  if (!bVar2) {
    while (bVar2 = std::operator!=((_Self *)local_30,&cb_range.first), bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
                             *)local_30);
      sVar4 = std::
              map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->cb_to_hostname_,&ppVar3->second);
      if (sVar4 != 0) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
                               *)local_30);
        std::
        map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&this->cb_to_hostname_,&ppVar3->second);
      }
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
                             *)local_30);
      pIVar1 = ppVar3->second;
      std::__cxx11::string::string(local_50,(string *)hostname);
      std::__cxx11::string::string(local_70,(string *)ip);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"",&local_a1);
      (*pIVar1->_vptr_IDNSNotify[2])(pIVar1,local_50,local_70,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
                    *)local_30);
    }
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
    ::erase(&this->hostname_to_cb_,hostname);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::erase(&this->hostname_status_,hostname);
  }
  return;
}

Assistant:

void DNSResolve::CallCallback(string hostname, string ip)
{
    auto cb_range = hostname_to_cb_.equal_range(hostname);
    if (cb_range.first == cb_range.second)
        return;
    while (cb_range.first != cb_range.second)
    {
        if (cb_to_hostname_.count(cb_range.first->second) > 0)
        {
            cb_to_hostname_.erase(cb_range.first->second);
        }
        cb_range.first->second->DNSResolved(hostname, ip, "");
        ++cb_range.first;
    }
    hostname_to_cb_.erase(hostname);
    hostname_status_.erase(hostname);
}